

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecSet.h
# Opt level: O0

int Vec_SetAppend(Vec_Set_t *p,int *pArray,int nSize)

{
  int nWords_00;
  int iVar1;
  word *pwVar2;
  word **local_28;
  int nWords;
  int nSize_local;
  int *pArray_local;
  Vec_Set_t *p_local;
  
  nWords_00 = Vec_SetWordNum(nSize);
  if (nWords_00 < 1 << ((byte)p->nPageSize & 0x1f)) {
    p->nEntries = p->nEntries + 1;
    iVar1 = Vec_SetLimit(p->pPages[p->iPage]);
    if (1 << ((byte)p->nPageSize & 0x1f) <= iVar1 + nWords_00) {
      iVar1 = p->iPage + 1;
      p->iPage = iVar1;
      if (iVar1 == p->nPagesAlloc) {
        if (p->pPages == (word **)0x0) {
          local_28 = (word **)malloc((long)(p->nPagesAlloc << 1) << 3);
        }
        else {
          local_28 = (word **)realloc(p->pPages,(long)(p->nPagesAlloc << 1) << 3);
        }
        p->pPages = local_28;
        memset(p->pPages + p->nPagesAlloc,0,(long)p->nPagesAlloc << 3);
        p->nPagesAlloc = p->nPagesAlloc << 1;
      }
      if (p->pPages[p->iPage] == (word *)0x0) {
        pwVar2 = (word *)malloc((long)(int)(1L << ((byte)p->nPageSize & 0x3f)) << 3);
        p->pPages[p->iPage] = pwVar2;
      }
      Vec_SetWriteLimit(p->pPages[p->iPage],2);
      p->pPages[p->iPage][1] = 0xffffffffffffffff;
    }
    if (pArray != (int *)0x0) {
      pwVar2 = p->pPages[p->iPage];
      iVar1 = Vec_SetLimit(p->pPages[p->iPage]);
      memcpy(pwVar2 + iVar1,pArray,(long)nSize << 2);
    }
    Vec_SetIncLimit(p->pPages[p->iPage],nWords_00);
    iVar1 = Vec_SetHandCurrent(p);
    return iVar1 - nWords_00;
  }
  __assert_fail("nWords < (1 << p->nPageSize)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecSet.h"
                ,0xd8,"int Vec_SetAppend(Vec_Set_t *, int *, int)");
}

Assistant:

static inline int Vec_SetAppend( Vec_Set_t * p, int * pArray, int nSize )
{
    int nWords = Vec_SetWordNum( nSize );
    assert( nWords < (1 << p->nPageSize) );
    p->nEntries++;
    if ( Vec_SetLimit( p->pPages[p->iPage] ) + nWords >= (1 << p->nPageSize) )
    {
        if ( ++p->iPage == p->nPagesAlloc )
        {
            p->pPages = ABC_REALLOC( word *, p->pPages, p->nPagesAlloc * 2 );
            memset( p->pPages + p->nPagesAlloc, 0, sizeof(word *) * (size_t)p->nPagesAlloc );
            p->nPagesAlloc *= 2;
        }
        if ( p->pPages[p->iPage] == NULL )
            p->pPages[p->iPage] = ABC_ALLOC( word, (int)(((word)1) << p->nPageSize) );
        Vec_SetWriteLimit( p->pPages[p->iPage], 2 );
        p->pPages[p->iPage][1] = ~0;
    }
    if ( pArray )
        memcpy( p->pPages[p->iPage] + Vec_SetLimit(p->pPages[p->iPage]), pArray, sizeof(int) * (size_t)nSize );
    Vec_SetIncLimit( p->pPages[p->iPage], nWords );
    return Vec_SetHandCurrent(p) - nWords;
}